

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall CTPNStmObjectBase::add_superclass(CTPNStmObjectBase *this,CTcSymbol *sym)

{
  CTPNSuperclass *pCVar1;
  
  pCVar1 = (CTPNSuperclass *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)sym);
  (pCVar1->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_00311e20;
  pCVar1->sym_ = sym;
  pCVar1->nxt_ = (CTPNSuperclass *)0x0;
  pCVar1->sym_txt_ = (textchar_t *)0x0;
  pCVar1->sym_len_ = 0;
  *(this->super_CTPNObjDef).sclist_.dst_ = pCVar1;
  (this->super_CTPNObjDef).sclist_.dst_ = &pCVar1->nxt_;
  pCVar1->nxt_ = (CTPNSuperclass *)0x0;
  pCVar1->prv_ = (this->super_CTPNObjDef).sclist_.tail_;
  (this->super_CTPNObjDef).sclist_.tail_ = pCVar1;
  return;
}

Assistant:

void CTPNStmObjectBase::add_superclass(CTcSymbol *sym)
{
    /* add a new superclass entry to my list */
    sclist_.append(new CTPNSuperclass(sym));
}